

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O1

void __thiscall
test::iu_FilePath_x_iutest_x_RemoveDirectoryName_Test::Body
          (iu_FilePath_x_iutest_x_RemoveDirectoryName_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  char *ps;
  iuFilePath *in_R9;
  AssertionResult iutest_ar;
  FilePath path;
  allocator<char> local_221;
  AssertionResult local_220;
  iuFilePath local_1f8;
  AssertionHelper local_1d8;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  iutest::detail::iuFilePath::iuFilePath(&local_1f8,"test.exe");
  pcVar3 = local_1f8.m_path._M_dataplus._M_p + local_1f8.m_path._M_string_length;
  for (pcVar4 = local_1f8.m_path._M_dataplus._M_p + (local_1f8.m_path._M_string_length - 1);
      local_1f8.m_path._M_dataplus._M_p <= pcVar4; pcVar4 = pcVar4 + -1) {
    if (pcVar3[-1] == '/') {
      if (-1 < pcVar3[-2]) goto LAB_00245c9b;
      pcVar4 = pcVar3 + -2;
    }
    pcVar3 = pcVar4;
  }
  pcVar4 = (pointer)0x0;
LAB_00245c9b:
  if (pcVar4 == (pointer)0x0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_1a8);
  }
  else {
    iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_1a8,pcVar4 + 1);
  }
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_220,(internal *)"\"test.exe\"","path.RemoveDirectoryName()","test.exe",
             (char (*) [9])local_1a8,in_R9);
  pcVar3 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_220.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_220.m_message._M_dataplus._M_p,&local_221);
    local_1d8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_1d8.m_part_result.super_iuCodeMessage.m_line = 0xd4;
    local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  paVar1 = &local_220.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_message._M_dataplus._M_p,
                    local_220.m_message.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_1f8.m_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8.m_path._M_dataplus._M_p,
                    local_1f8.m_path.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::iuFilePath::iuFilePath(&local_1f8,"test/test.exe");
  pcVar4 = local_1f8.m_path._M_dataplus._M_p + local_1f8.m_path._M_string_length;
  for (pcVar5 = local_1f8.m_path._M_dataplus._M_p + (local_1f8.m_path._M_string_length - 1);
      local_1f8.m_path._M_dataplus._M_p <= pcVar5; pcVar5 = pcVar5 + -1) {
    if (pcVar4[-1] == '/') {
      if (-1 < pcVar4[-2]) goto LAB_00245e41;
      pcVar5 = pcVar4 + -2;
    }
    pcVar4 = pcVar5;
  }
  pcVar5 = (pointer)0x0;
LAB_00245e41:
  if (pcVar5 == (pointer)0x0) {
    local_1a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char*>();
  }
  else {
    iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_1a8,pcVar5 + 1);
  }
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_220,(internal *)"\"test.exe\"","path.RemoveDirectoryName()","test.exe",
             (char (*) [9])local_1a8,in_R9);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_220.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_220.m_message._M_dataplus._M_p,&local_221);
    local_1d8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_1d8.m_part_result.super_iuCodeMessage.m_line = 0xd8;
    local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_message._M_dataplus._M_p,
                    local_220.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8.m_path._M_dataplus._M_p,
                    local_1f8.m_path.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(FilePath, RemoveDirectoryName)
{
    {
        ::iutest::internal::FilePath path("test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveDirectoryName());
    }
    {
        ::iutest::internal::FilePath path("test/test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveDirectoryName());
    }
}